

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O0

string_t * __thiscall
cfgfile::tag_scalar_vector_t<int,cfgfile::string_trait_t>::print_abi_cxx11_
          (tag_scalar_vector_t<int,_cfgfile::string_trait_t> *this,int indent)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type __n;
  reference pptVar3;
  int in_EDX;
  tag_t<cfgfile::string_trait_t> *in_RSI;
  char cVar4;
  string_t *in_RDI;
  string_t *in_stack_00000078;
  tag_t<cfgfile::string_trait_t> *tag;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  child_tags_list_t *__range4;
  string_t value;
  int *v;
  const_iterator __end0;
  const_iterator __begin0;
  values_vector_t *__range3;
  string_t *result;
  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  *in_stack_fffffffffffffe78;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  *in_stack_fffffffffffffe90;
  char __c;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  allocator<char> local_111;
  string local_110 [32];
  string local_f0 [32];
  tag_t<cfgfile::string_trait_t> *local_d0;
  tag_t<cfgfile::string_trait_t> **local_c8;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  local_c0;
  size_type local_b8;
  string local_b0 [32];
  string local_90 [32];
  reference local_70;
  int *local_68;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  tag_t<cfgfile::string_trait_t> *local_58;
  allocator<char> local_49;
  string local_48 [51];
  undefined1 local_15;
  int local_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined4 extraout_var_00;
  
  local_15 = 0;
  local_14 = in_EDX;
  std::__cxx11::string::string((string *)in_RDI);
  bVar1 = tag_t<cfgfile::string_trait_t>::is_defined(in_stack_fffffffffffffe98);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98,
               (char)((ulong)in_stack_fffffffffffffe90 >> 0x38),
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
    cVar4 = (char)in_RDI;
    std::__cxx11::string::push_back(cVar4);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(in_RSI);
    std::__cxx11::string::append((string *)in_RDI);
    local_58 = in_RSI + 1;
    local_60._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe78);
    local_68 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffffe80,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffffe78), bVar1) {
      local_70 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_60);
      std::__cxx11::string::push_back(cVar4);
      format_t<int,cfgfile::string_trait_t>::to_string_abi_cxx11_((int *)in_stack_fffffffffffffe78);
      to_cfgfile_format<cfgfile::string_trait_t>(in_stack_00000078);
      std::__cxx11::string::operator=(local_90,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::append((string *)in_RDI);
      std::__cxx11::string::~string(local_90);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_60);
    }
    iVar2 = (*in_RSI->_vptr_tag_t[2])();
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(extraout_var,iVar2);
    bVar1 = std::
            vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            ::empty(in_stack_fffffffffffffe90);
    if (!bVar1) {
      std::__cxx11::string::push_back(cVar4);
      iVar2 = (*in_RSI->_vptr_tag_t[2])();
      __n = CONCAT44(extraout_var_00,iVar2);
      local_b8 = __n;
      local_c0._M_current =
           (tag_t<cfgfile::string_trait_t> **)
           std::
           vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
           ::begin(in_stack_fffffffffffffe78);
      local_c8 = (tag_t<cfgfile::string_trait_t> **)
                 std::
                 vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                 ::end(in_stack_fffffffffffffe78);
      while (bVar1 = __gnu_cxx::operator!=
                               (in_stack_fffffffffffffe80,
                                (__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                                 *)in_stack_fffffffffffffe78), bVar1) {
        pptVar3 = __gnu_cxx::
                  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                  ::operator*(&local_c0);
        local_d0 = *pptVar3;
        (*local_d0->_vptr_tag_t[3])(local_f0,local_d0,(ulong)(local_14 + 1));
        std::__cxx11::string::append((string *)in_RDI);
        std::__cxx11::string::~string(local_f0);
        __gnu_cxx::
        __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
        ::operator++(&local_c0);
      }
      iVar2 = (int)const_t<cfgfile::string_trait_t>::c_tab;
      __c = (char)((ulong)&local_111 >> 0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,__n,__c,(allocator<char> *)CONCAT44(iVar2,in_stack_fffffffffffffe88));
      std::__cxx11::string::append((string *)in_RDI);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator(&local_111);
    }
    std::__cxx11::string::push_back(cVar4);
    std::__cxx11::string::push_back(cVar4);
  }
  return in_RDI;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );
			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );

			for( const T & v : m_values )
			{
				result.push_back( const_t< Trait >::c_space );

				typename Trait::string_t value =
					format_t< T, Trait >::to_string( v );

				value = to_cfgfile_format< Trait >( value );

				result.append( value );
			}

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}